

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

bool QFSFileEngine::setCurrentPath(QString *path)

{
  bool bVar1;
  long in_FS_OFFSET;
  QFileSystemEntry local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::QFileSystemEntry(&local_48,path);
  bVar1 = QFileSystemEngine::setCurrentPath(&local_48);
  if (&(local_48.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_48.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_48.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_48.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_48.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_48.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::setCurrentPath(const QString &path)
{
    return QFileSystemEngine::setCurrentPath(QFileSystemEntry(path));
}